

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void cpu_sync_bndcs_hflags_x86_64(CPUX86State *env)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = env->hflags;
  uVar1 = env->bnd_regs[(ulong)((~uVar2 & 3) != 0) + 4].lb;
  if ((((*(byte *)((long)env->cr + 0x22) & 4) == 0) || ((env->xcr0 & 0x10) == 0)) ||
     ((uVar1 & 1) == 0)) {
    uVar2 = uVar2 & 0xfdffffff;
  }
  else {
    uVar2 = uVar2 | 0x2000000;
  }
  env->hflags = uVar2;
  env->hflags2 = ((uint)uVar1 & 2) << 4 | env->hflags2 & 0xffffffdf;
  return;
}

Assistant:

void cpu_sync_bndcs_hflags(CPUX86State *env)
{
    uint32_t hflags = env->hflags;
    uint32_t hflags2 = env->hflags2;
    uint32_t bndcsr;

    if ((hflags & HF_CPL_MASK) == 3) {
        bndcsr = env->bndcs_regs.cfgu;
    } else {
        bndcsr = env->msr_bndcfgs;
    }

    if ((env->cr[4] & CR4_OSXSAVE_MASK)
        && (env->xcr0 & XSTATE_BNDCSR_MASK)
        && (bndcsr & BNDCFG_ENABLE)) {
        hflags |= HF_MPX_EN_MASK;
    } else {
        hflags &= ~HF_MPX_EN_MASK;
    }

    if (bndcsr & BNDCFG_BNDPRESERVE) {
        hflags2 |= HF2_MPX_PR_MASK;
    } else {
        hflags2 &= ~HF2_MPX_PR_MASK;
    }

    env->hflags = hflags;
    env->hflags2 = hflags2;
}